

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O0

bool S2::CompareEdges<double>
               (Vector3<double> *a0,Vector3<double> *a1,Vector3<double> *b0,Vector3<double> *b1)

{
  bool bVar1;
  bool local_4a;
  bool local_49;
  Vector3<double> *local_48;
  Vector3<double> *pb1;
  Vector3<double> *pb0;
  Vector3<double> *pa1;
  Vector3<double> *pa0;
  Vector3<double> *b1_local;
  Vector3<double> *b0_local;
  Vector3<double> *a1_local;
  Vector3<double> *a0_local;
  
  local_48 = b1;
  pb1 = b0;
  pb0 = a1;
  pa1 = a0;
  pa0 = b1;
  b1_local = b0;
  b0_local = a1;
  a1_local = a0;
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator>=
                    ((BasicVector<Vector3,_double,_3UL> *)a0,a1);
  if (bVar1) {
    std::swap<Vector3<double>const*>(&pa1,&pb0);
  }
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator>=
                    ((BasicVector<Vector3,_double,_3UL> *)pb1,local_48);
  if (bVar1) {
    std::swap<Vector3<double>const*>(&pb1,&local_48);
  }
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator<
                    ((BasicVector<Vector3,_double,_3UL> *)pa1,pb1);
  local_49 = true;
  if (!bVar1) {
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)pa1,pb1);
    local_4a = false;
    if (bVar1) {
      local_4a = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator<
                           ((BasicVector<Vector3,_double,_3UL> *)pb1,local_48);
    }
    local_49 = local_4a;
  }
  return local_49;
}

Assistant:

static bool CompareEdges(const Vector3<T>& a0, const Vector3<T>& a1,
                         const Vector3<T>& b0, const Vector3<T>& b1) {
  const Vector3<T> *pa0 = &a0, *pa1 = &a1;
  const Vector3<T> *pb0 = &b0, *pb1 = &b1;
  if (*pa0 >= *pa1) std::swap(pa0, pa1);
  if (*pb0 >= *pb1) std::swap(pb0, pb1);
  return *pa0 < *pb0 || (*pa0 == *pb0 && *pb0 < *pb1);
}